

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcentricFinder.h
# Opt level: O0

int ZXing::CheckSymmetricPattern<true,ZXing::FixedPattern<5,7,false>>
              (BitMatrixCursorI *cur,FixedPattern<5,_7,_false> pattern,int range,bool updatePosition
              )

{
  value_type_conflict2 vVar1;
  unsigned_short uVar2;
  int iVar3;
  reference pvVar4;
  int in_ECX;
  undefined2 in_DX;
  undefined8 in_RSI;
  array<unsigned_short,_5UL> *in_RDI;
  byte in_R8B;
  double dVar5;
  int i;
  anon_class_24_3_10afa19a next;
  int s_2;
  Pattern<pattern_size()>_conflict res;
  int centerBwd;
  int centerFwd;
  FastEdgeToEdgeCounter curBwd;
  FastEdgeToEdgeCounter curFwd;
  Pattern<5UL> *in_stack_ffffffffffffff28;
  PatternView *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined2 in_stack_ffffffffffffff3c;
  undefined2 in_stack_ffffffffffffff3e;
  BitMatrixCursor<ZXing::PointT<int>_> *in_stack_ffffffffffffff40;
  BitMatrixCursor<ZXing::PointT<int>_> *in_stack_ffffffffffffff50;
  BitMatrixCursorI *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int iVar6;
  undefined1 local_7a [10];
  int local_70;
  int local_6c;
  byte local_2d;
  int local_2c;
  undefined2 in_stack_ffffffffffffffe0;
  undefined6 uVar7;
  undefined2 uStack_18;
  int in_stack_ffffffffffffffec;
  undefined2 in_stack_fffffffffffffff0;
  undefined6 uVar8;
  undefined4 in_stack_fffffffffffffffc;
  uint uVar9;
  
  uVar7 = (undefined6)in_RSI;
  uStack_18 = (undefined2)((ulong)in_RSI >> 0x30);
  local_2d = in_R8B & 1;
  local_2c = in_ECX;
  uVar8 = uVar7;
  FastEdgeToEdgeCounter::FastEdgeToEdgeCounter
            ((FastEdgeToEdgeCounter *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff58);
  BitMatrixCursor<ZXing::PointT<int>_>::turnedBack(in_stack_ffffffffffffff50);
  FastEdgeToEdgeCounter::FastEdgeToEdgeCounter
            ((FastEdgeToEdgeCounter *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff58);
  local_6c = FastEdgeToEdgeCounter::stepToNextEdge
                       ((FastEdgeToEdgeCounter *)
                        CONCAT26(in_stack_ffffffffffffff3e,
                                 CONCAT24(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)),
                        (int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
  if (local_6c == 0) {
    uVar9 = 0;
  }
  else {
    local_70 = FastEdgeToEdgeCounter::stepToNextEdge
                         ((FastEdgeToEdgeCounter *)
                          CONCAT26(in_stack_ffffffffffffff3e,
                                   CONCAT24(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)),
                          (int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
    if (local_70 == 0) {
      uVar9 = 0;
    }
    else {
      memset(local_7a,0,10);
      vVar1 = ((short)local_6c + (short)local_70) - 1;
      pvVar4 = std::array<unsigned_short,_5UL>::operator[]
                         ((array<unsigned_short,_5UL> *)in_stack_ffffffffffffff30,
                          (size_type)in_stack_ffffffffffffff28);
      *pvVar4 = vVar1;
      pvVar4 = std::array<unsigned_short,_5UL>::operator[]
                         ((array<unsigned_short,_5UL> *)in_stack_ffffffffffffff30,
                          (size_type)in_stack_ffffffffffffff28);
      local_2c = local_2c - (uint)*pvVar4;
      for (iVar6 = 1; iVar6 < 3; iVar6 = iVar6 + 1) {
        iVar3 = CheckSymmetricPattern<true,ZXing::FixedPattern<5,7,false>>(ZXing::BitMatrixCursor<ZXing::PointT<int>>&,ZXing::FixedPattern<5,7,false>,int,bool)
                ::{lambda(auto:1&,int)#1}::operator()
                          ((anon_class_24_3_10afa19a *)in_stack_ffffffffffffff40,
                           (FastEdgeToEdgeCounter *)
                           CONCAT26(in_stack_ffffffffffffff3e,
                                    CONCAT24(vVar1,in_stack_ffffffffffffff38)),
                           (int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
        if ((iVar3 == 0) ||
           (iVar3 = CheckSymmetricPattern<true,ZXing::FixedPattern<5,7,false>>(ZXing::BitMatrixCursor<ZXing::PointT<int>>&,ZXing::FixedPattern<5,7,false>,int,bool)
                    ::{lambda(auto:1&,int)#1}::operator()
                              ((anon_class_24_3_10afa19a *)in_stack_ffffffffffffff40,
                               (FastEdgeToEdgeCounter *)
                               CONCAT26(in_stack_ffffffffffffff3e,
                                        CONCAT24(vVar1,in_stack_ffffffffffffff38)),
                               (int)((ulong)in_stack_ffffffffffffff30 >> 0x20)), iVar3 == 0)) {
          return 0;
        }
      }
      PatternView::PatternView<5ul>(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      dVar5 = IsPattern<true,5,7>((PatternView *)
                                  CONCAT44(in_stack_fffffffffffffffc,CONCAT22(in_DX,uStack_18)),
                                  (FixedPattern<5,_7,_false> *)
                                  CONCAT62(uVar8,in_stack_fffffffffffffff0),
                                  in_stack_ffffffffffffffec,
                                  (double)CONCAT62(uVar7,in_stack_ffffffffffffffe0),(double)in_RDI);
      if (dVar5 == 0.0) {
        uVar9 = 0;
      }
      else {
        if ((local_2d & 1) != 0) {
          std::array<unsigned_short,_5UL>::operator[](in_RDI,(size_type)in_stack_ffffffffffffff28);
          BitMatrixCursor<ZXing::PointT<int>_>::step
                    (in_stack_ffffffffffffff40,CONCAT22(in_stack_ffffffffffffff3e,vVar1));
        }
        uVar2 = Reduce<std::array<unsigned_short,5ul>,unsigned_short,std::plus<unsigned_short>>
                          (local_7a,0);
        uVar9 = (uint)uVar2;
      }
    }
  }
  return uVar9;
}

Assistant:

int CheckSymmetricPattern(BitMatrixCursorI& cur, PATTERN pattern, int range, bool updatePosition)
{
	FastEdgeToEdgeCounter curFwd(cur), curBwd(cur.turnedBack());

	int centerFwd = curFwd.stepToNextEdge(range);
	if (!centerFwd)
		return 0;
	int centerBwd = curBwd.stepToNextEdge(range);
	if (!centerBwd)
		return 0;

	assert(range > 0);
	Pattern<pattern.size()> res = {};
	auto constexpr s_2 = Size(res)/2;
	res[s_2] = centerFwd + centerBwd - 1; // -1 because the starting pixel is counted twice
	range -= res[s_2];

	auto next = [&](auto& cur, int i) {
		auto v = cur.stepToNextEdge(range);
		res[s_2 + i] = v;
		range -= v;
		return v;
	};

	for (int i = 1; i <= s_2; ++i) {
		if (!next(curFwd, i) || !next(curBwd, -i))
			return 0;
	}

	if (!IsPattern<RELAXED_THRESHOLD>(res, pattern))
		return 0;

	if (updatePosition)
		cur.step(res[s_2] / 2 - (centerBwd - 1));

	return Reduce(res);
}